

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  bool bVar1;
  TokenType TVar2;
  TokenType TVar3;
  Result RVar4;
  Script *script;
  Enum EVar5;
  TokenTypePair pair;
  long lVar6;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> command;
  _Head_base<0UL,_wabt::ModuleCommand_*,_false> local_a0;
  undefined1 local_98 [32];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  size_type sStack_50;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_48;
  undefined8 uStack_40;
  
  script = (Script *)operator_new(0x50);
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_bucket_count = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_element_count = 0;
  *(undefined8 *)
   &(script->module_bindings).
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy = 0;
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_buckets =
       &(script->module_bindings).
        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
        ._M_h._M_single_bucket;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_bucket_count = 1;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_element_count = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  TVar2 = Peek(this,0);
  TVar3 = Peek(this,1);
  pair._M_elems[1] = TVar3;
  pair._M_elems[0] = TVar2;
  bVar1 = anon_unknown_1::IsModuleField(pair);
  if (bVar1) {
    MakeUnique<wabt::ModuleCommand>();
    GetToken((Token *)local_98,this);
    local_48.offset = local_98._16_8_;
    uStack_40 = local_98._24_8_;
    local_58 = (char *)local_98._0_8_;
    sStack_50 = local_98._8_8_;
    ((local_a0._M_head_impl)->module).loc.field_1.field_1.offset = local_98._16_8_;
    *(undefined8 *)((long)&((local_a0._M_head_impl)->module).loc.field_1 + 8) = local_98._24_8_;
    ((local_a0._M_head_impl)->module).loc.filename.data_ = (char *)local_98._0_8_;
    ((local_a0._M_head_impl)->module).loc.filename.size_ = local_98._8_8_;
    RVar4 = ParseModuleFieldList(this,&(local_a0._M_head_impl)->module);
    if (RVar4.enum_ != Error) {
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)script,
                 (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                 &local_a0);
    }
    if (local_a0._M_head_impl != (ModuleCommand *)0x0) {
      (*((local_a0._M_head_impl)->super_CommandMixin<(wabt::CommandType)0>).super_Command.
        _vptr_Command[1])();
    }
joined_r0x00166866:
    EVar5 = Error;
    if (RVar4.enum_ == Error) goto LAB_00166950;
  }
  else {
    TVar2 = Peek(this,0);
    TVar3 = Peek(this,1);
    if (((TVar2 == Lpar) && (TVar3 < Result)) && ((0x4846400fcU >> ((ulong)TVar3 & 0x3f) & 1) != 0))
    {
      RVar4 = ParseCommandList(this,script,(CommandPtrVector *)script);
      goto joined_r0x00166866;
    }
    Match(this,Lpar);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"a module field","");
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"a command","");
    local_58 = (char *)0x0;
    sStack_50 = 0;
    local_48.offset = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
               (string *)local_98,&local_58);
    lVar6 = 0;
    ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_58,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    do {
      if (local_68 + lVar6 != *(undefined1 **)((long)local_78 + lVar6)) {
        operator_delete(*(undefined1 **)((long)local_78 + lVar6));
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x40);
  }
  RVar4 = Expect(this,Eof);
  EVar5 = Error;
  if ((RVar4.enum_ != Error) &&
     ((this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    std::__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>::reset
              ((__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_> *)out_script,
               script);
    script = (Script *)0x0;
    EVar5 = Ok;
  }
LAB_00166950:
  if (script != (Script *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                   *)&script->module_bindings);
    std::
    vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
    ::~vector(&script->commands);
    operator_delete(script);
  }
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = MakeUnique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = MakeUnique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}